

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O2

string * slack::_detail::join<slack::_detail::Element>
                   (string *__return_storage_ptr__,
                   vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_> *vec,
                   string *sep)

{
  Element *element;
  ostream *os;
  long lVar1;
  size_t i;
  ulong uVar2;
  allocator local_1b9;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  element = (vec->
            super__Vector_base<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((vec->super__Vector_base<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>).
      _M_impl.super__Vector_impl_data._M_finish == element) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_1b9);
  }
  else {
    operator<<(local_1a8,element);
    lVar1 = 0x40;
    for (uVar2 = 1;
        uVar2 < (ulong)((long)(vec->
                              super__Vector_base<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(vec->
                              super__Vector_base<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 6); uVar2 = uVar2 + 1) {
      os = std::operator<<(local_1a8,(string *)sep);
      operator<<(os,(Element *)
                    ((long)&(((vec->
                              super__Vector_base<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>
                              )._M_impl.super__Vector_impl_data._M_start)->label)._M_dataplus._M_p +
                    lVar1));
      lVar1 = lVar1 + 0x40;
    }
    std::__cxx11::stringbuf::str();
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

inline
std::string join(const std::vector<T>& vec, const std::string& sep) {
    std::stringstream ss;
    if (vec.size() == 0) { return ""; };
    ss << vec[0];
    for (size_t i = 1; i < vec.size(); i ++) { ss << sep << vec[i]; }
    return ss.str();
}